

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O2

void InitRootMove(Situation *situation,int *num_of_all_movements,Movement *all_movements)

{
  pointer pMVar1;
  UINT8 UVar2;
  undefined2 uVar3;
  UINT8 UVar4;
  undefined1 uVar5;
  UINT32 UVar6;
  bool bVar7;
  long lVar8;
  Movement *move;
  int i;
  int iVar9;
  
  GetAllCaptureMovements(situation,num_of_all_movements,all_movements);
  CaptureValue(situation,num_of_all_movements,all_movements);
  std::__sort<Movement*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
            (all_movements,all_movements + *num_of_all_movements,
             (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x106c80);
  iVar9 = *num_of_all_movements;
  GetAllNotCaptureMovements(situation,num_of_all_movements,all_movements);
  for (; iVar9 < *num_of_all_movements; iVar9 = iVar9 + 1) {
    lVar8 = (long)iVar9;
    move = all_movements + lVar8;
    bVar7 = MakeAMove(situation,move,true);
    if (bVar7) {
      for (; lVar8 < (long)*num_of_all_movements + -1; lVar8 = lVar8 + 1) {
        UVar2 = move[1].movec;
        uVar3 = *(undefined2 *)&move[1].field_0xa;
        move->catc = move[1].catc;
        move->movec = UVar2;
        *(undefined2 *)&move->field_0xa = uVar3;
        UVar2 = move[1].to;
        UVar4 = move[1].capture;
        uVar5 = move[1].field_0x3;
        UVar6 = move[1].value;
        move->from = move[1].from;
        move->to = UVar2;
        move->capture = UVar4;
        move->field_0x3 = uVar5;
        move->value = UVar6;
        move = move + 1;
      }
      *num_of_all_movements = (int)((long)*num_of_all_movements + -1);
      iVar9 = iVar9 + -1;
    }
    UnMakeAMove(situation);
  }
  pMVar1 = (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar1) {
    (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar1;
  }
  return;
}

Assistant:

void InitRootMove(Situation& situation, int& num_of_all_movements, Movement* all_movements){
    // 吃子着法
    GetAllCaptureMovements(situation, num_of_all_movements, all_movements);
    CaptureValue(situation, num_of_all_movements, all_movements);
    std::sort(all_movements, all_movements + num_of_all_movements, cmp);
    int numofnocap = num_of_all_movements;
    // 不吃子着法
    GetAllNotCaptureMovements(situation, num_of_all_movements, all_movements);
    for(int i = numofnocap; i < num_of_all_movements; i ++){
        if(MakeAMove(situation, all_movements[i], 1)){
            // std::cout << "remove " << int(all_movements[i].from) << " " << int(all_movements[i].to) << " \n";
            for(int j = i; j < num_of_all_movements - 1; j ++){
                all_movements[j] = all_movements[j + 1];
            }
            num_of_all_movements --;
            i--;
        }
        UnMakeAMove(situation);
    }
    situation.moves_stack.clear();
}